

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

QProcessEnvironment __thiscall
QProcessEnvironmentPrivate::fromList(QProcessEnvironmentPrivate *this,QStringList *list)

{
  char *__file;
  __off_t __length;
  long lVar1;
  QString *this_00;
  long in_FS_OFFSET;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QProcessEnvironment::QProcessEnvironment((QProcessEnvironment *)this);
  lVar1 = (list->d).size;
  if (lVar1 != 0) {
    this_00 = (list->d).ptr;
    lVar1 = lVar1 * 0x18;
    do {
      __file = (char *)QString::indexOf(this_00,(QChar)0x3d,1,CaseSensitive);
      if (0 < (long)__file) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::mid(&local_58,this_00,(qsizetype)(__file + 1),-1);
        local_78.d.d = (this_00->d).d;
        local_78.d.ptr = (this_00->d).ptr;
        local_78.d.size = (this_00->d).size;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::truncate(&local_78,__file,__length);
        QProcessEnvironment::insert((QProcessEnvironment *)this,&local_78,&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSharedDataPointer<QProcessEnvironmentPrivate>)
           (QSharedDataPointer<QProcessEnvironmentPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QProcessEnvironment QProcessEnvironmentPrivate::fromList(const QStringList &list)
{
    QProcessEnvironment env;
    QStringList::ConstIterator it = list.constBegin(),
                              end = list.constEnd();
    for ( ; it != end; ++it) {
        const qsizetype pos = it->indexOf(u'=', 1);
        if (pos < 1)
            continue;

        QString value = it->mid(pos + 1);
        QString name = *it;
        name.truncate(pos);
        env.insert(name, value);
    }
    return env;
}